

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void __thiscall Omega_h::HostWrite<signed_char>::set(HostWrite<signed_char> *this,LO i,char value)

{
  char value_local;
  LO i_local;
  HostWrite<signed_char> *this_local;
  
  *(char *)((long)(this->write_).shared_alloc_.direct_ptr + (long)i) = value;
  return;
}

Assistant:

void HostWrite<T>::set(LO i, T value) {
#ifdef OMEGA_H_CHECK_BOUNDS
    OMEGA_H_CHECK(0 <= i);
    OMEGA_H_CHECK(i < size());
#endif
#ifdef OMEGA_H_USE_KOKKOS
  mirror_[i] = value;
#elif defined(OMEGA_H_USE_CUDA)
  mirror_[std::size_t(i)] = value;
#else
  write_[i] = value;
#endif
}